

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TransRepeatRangeSyntax::setChild
          (TransRepeatRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00455ce8 + *(int *)(&DAT_00455ce8 + index * 4)))();
  return;
}

Assistant:

void TransRepeatRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: specifier = child.token(); return;
        case 2: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}